

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

void __thiscall
IRBuilder::BuildReg1Unsigned1(IRBuilder *this,OpCode newOpcode,uint offset,RegSlot R0,int32 C1)

{
  undefined1 *puVar1;
  uint uVar2;
  Func *pFVar3;
  code *pcVar4;
  bool bVar5;
  byte bVar6;
  ValueType valueType;
  RegSlot RVar7;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar8;
  Opnd *this_01;
  RegOpnd *pRVar9;
  IntConstOpnd *pIVar10;
  Instr *pIVar11;
  RegOpnd *pRVar12;
  StackSym *pSVar13;
  uint offset_00;
  int iVar14;
  undefined6 in_register_00000032;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_38;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_36;
  uint local_34;
  
  iVar14 = (int)CONCAT62(in_register_00000032,newOpcode);
  local_34 = offset;
  if (iVar14 < 0xdb) {
    if (iVar14 != 0x48) {
      if (iVar14 != 0xb9) goto LAB_004cdf3b;
      RVar7 = InnerScopeIndexToRegSlot(this,C1);
      pRVar9 = BuildSrcOpnd(this,RVar7,TyVar);
      pRVar12 = BuildDstOpnd(this,R0,TyVar,false,false);
      pIVar11 = IR::Instr::New(LdFrameDisplay,&pRVar12->super_Opnd,&pRVar9->super_Opnd,this->m_func)
      ;
      offset_00 = local_34;
      AddEnvOpndForInnerFrameDisplay(this,pIVar11,local_34);
      uVar2 = *(uint *)&pRVar12->m_sym->field_0x18;
      if ((uVar2 & 1) != 0) {
        *(uint *)&pRVar12->m_sym->field_0x18 = uVar2 | 2;
      }
      goto LAB_004cdf28;
    }
    RVar7 = InnerScopeIndexToRegSlot(this,C1);
    pRVar9 = BuildSrcOpnd(this,RVar7,TyVar);
    pRVar12 = BuildDstOpnd(this,R0,TyVar,false,false);
    pIVar11 = IR::Instr::New(Ld_A,&pRVar12->super_Opnd,&pRVar9->super_Opnd,this->m_func);
    pSVar13 = pRVar12->m_sym;
  }
  else {
    if (iVar14 != 0xdb) {
      if (iVar14 != 0xe4) {
        if (iVar14 == 0xe2) {
          BuildRegexFromPattern(this,R0,C1,offset);
          return;
        }
LAB_004cdf3b:
        pRVar9 = BuildDstOpnd(this,R0,TyVar,false,false);
        pSVar13 = pRVar9->m_sym;
        pIVar10 = IR::IntConstOpnd::New((long)C1,TyInt32,this->m_func,false);
        pIVar11 = IR::Instr::New(newOpcode,&pRVar9->super_Opnd,&pIVar10->super_Opnd,this->m_func);
        AddInstr(this,pIVar11,local_34);
        if (newOpcode == NewScopeSlots) {
          pRVar12 = IR::RegOpnd::New(this->m_func->m_localClosureSym,TyVar,this->m_func);
          pIVar11 = IR::Instr::New(Ld_A,&pRVar12->super_Opnd,&pRVar9->super_Opnd,this->m_func);
          AddInstr(this,pIVar11,0xffffffff);
        }
        uVar2 = *(uint *)&pSVar13->field_0x18;
        if ((uVar2 & 1) != 0) {
          if ((newOpcode != NewScArrayWithMissingValues) && (newOpcode != NewScArray)) {
            return;
          }
          *(uint *)&pSVar13->field_0x18 = uVar2 | 6;
        }
        if ((newOpcode == NewScArrayWithMissingValues) || (newOpcode == NewScArray)) {
          local_36.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               ValueType::GetObject(Array);
          local_38.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               ValueType::SetHasNoMissingValues
                         ((ValueType *)&local_36.field_0,newOpcode == NewScArray);
          valueType = ValueType::SetArrayTypeId((ValueType *)&local_38.field_0,TypeIds_Array);
          IR::Opnd::SetValueType(&pRVar9->super_Opnd,valueType);
          puVar1 = &(pRVar9->super_Opnd).field_0xb;
          *puVar1 = *puVar1 | 1;
        }
        return;
      }
      pIVar11 = IR::Instr::New(InitForInEnumerator,this->m_func);
      pRVar9 = BuildSrcOpnd(this,R0,TyVar);
      if (pIVar11->m_src1 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
        if (!bVar5) goto LAB_004ce056;
        *puVar8 = 0;
      }
      pFVar3 = pIVar11->m_func;
      if ((pRVar9->super_Opnd).isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar5) goto LAB_004ce056;
        *puVar8 = 0;
      }
      bVar6 = (pRVar9->super_Opnd).field_0xb;
      if ((bVar6 & 2) != 0) {
        pRVar9 = (RegOpnd *)IR::Opnd::Copy(&pRVar9->super_Opnd,pFVar3);
        bVar6 = (pRVar9->super_Opnd).field_0xb;
      }
      offset_00 = local_34;
      (pRVar9->super_Opnd).field_0xb = bVar6 | 2;
      pIVar11->m_src1 = &pRVar9->super_Opnd;
      this_01 = BuildForInEnumeratorOpnd(this,C1,local_34);
      if (pIVar11->m_src2 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
        if (!bVar5) goto LAB_004ce056;
        *puVar8 = 0;
      }
      pFVar3 = pIVar11->m_func;
      if (this_01->isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar5) {
LAB_004ce056:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar8 = 0;
        offset_00 = local_34;
      }
      bVar6 = this_01->field_0xb;
      if ((bVar6 & 2) != 0) {
        this_01 = IR::Opnd::Copy(this_01,pFVar3);
        bVar6 = this_01->field_0xb;
      }
      this_01->field_0xb = bVar6 | 2;
      pIVar11->m_src2 = this_01;
      goto LAB_004cdf28;
    }
    this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    RVar7 = JITTimeFunctionBody::GetLocalClosureReg(this_00);
    pRVar9 = BuildSrcOpnd(this,RVar7,TyVar);
    pIVar10 = IR::IntConstOpnd::New((long)C1,TyUint32,this->m_func,false);
    pRVar12 = BuildDstOpnd(this,R0,TyVar,false,false);
    pIVar11 = IR::Instr::New(GetCachedFunc,&pRVar12->super_Opnd,&pRVar9->super_Opnd,
                             &pIVar10->super_Opnd,this->m_func);
    pSVar13 = pRVar12->m_sym;
  }
  offset_00 = local_34;
  if ((*(uint *)&pSVar13->field_0x18 & 1) != 0) {
    *(uint *)&pSVar13->field_0x18 = *(uint *)&pSVar13->field_0x18 | 2;
  }
LAB_004cdf28:
  AddInstr(this,pIVar11,offset_00);
  return;
}

Assistant:

void
IRBuilder::BuildReg1Unsigned1(Js::OpCode newOpcode, uint offset, Js::RegSlot R0, int32 C1)
{
    switch (newOpcode)
    {
        case Js::OpCode::NewRegEx:
            this->BuildRegexFromPattern(R0, C1, offset);
            return;

        case Js::OpCode::LdInnerScope:
        {
            IR::RegOpnd * srcOpnd = BuildSrcOpnd(this->InnerScopeIndexToRegSlot(C1));
            IR::RegOpnd * dstOpnd = BuildDstOpnd(R0);
            IR::Instr * instr = IR::Instr::New(Js::OpCode::Ld_A, dstOpnd, srcOpnd, m_func);
            if (dstOpnd->m_sym->m_isSingleDef)
            {
                dstOpnd->m_sym->m_isNotNumber = true;
            }
            this->AddInstr(instr, offset);
            return;
        }

        case Js::OpCode::LdIndexedFrameDisplayNoParent:
        {
            newOpcode = Js::OpCode::LdFrameDisplay;
            IR::RegOpnd *srcOpnd = this->BuildSrcOpnd(this->InnerScopeIndexToRegSlot(C1));
            IR::RegOpnd *dstOpnd = this->BuildDstOpnd(R0);
            IR::Instr *instr = IR::Instr::New(newOpcode, dstOpnd, srcOpnd, m_func);
            this->AddEnvOpndForInnerFrameDisplay(instr, offset);
            if (dstOpnd->m_sym->m_isSingleDef)
            {
                dstOpnd->m_sym->m_isNotNumber = true;
            }
            this->AddInstr(instr, offset);
            return;
        }

        case Js::OpCode::GetCachedFunc:
        {
            IR::RegOpnd *src1Opnd = this->BuildSrcOpnd(m_func->GetJITFunctionBody()->GetLocalClosureReg());
            IR::Opnd *src2Opnd = IR::IntConstOpnd::New(C1, TyUint32, m_func);
            IR::RegOpnd *dstOpnd = this->BuildDstOpnd(R0);
            IR::Instr *instr = IR::Instr::New(newOpcode, dstOpnd, src1Opnd, src2Opnd, m_func);
            if (dstOpnd->m_sym->m_isSingleDef)
            {
                dstOpnd->m_sym->m_isNotNumber = true;
            }
            this->AddInstr(instr, offset);
            return;
        }

        case Js::OpCode::InitForInEnumerator:
        {
            IR::Instr *instr = IR::Instr::New(Js::OpCode::InitForInEnumerator, m_func);
            instr->SetSrc1(this->BuildSrcOpnd(R0));
            instr->SetSrc2(this->BuildForInEnumeratorOpnd(C1, offset));
            this->AddInstr(instr, offset);
            return;
        }
    }


    IR::RegOpnd *   dstOpnd = this->BuildDstOpnd(R0);

    StackSym *      dstSym = dstOpnd->m_sym;
    IntConstType    value = C1;
    IR::IntConstOpnd * srcOpnd = IR::IntConstOpnd::New(value, TyInt32, m_func);
    IR::Instr *     instr = IR::Instr::New(newOpcode, dstOpnd, srcOpnd, m_func);

    this->AddInstr(instr, offset);

    if (newOpcode == Js::OpCode::NewScopeSlots)
    {
        this->AddInstr(
            IR::Instr::New(
                Js::OpCode::Ld_A, IR::RegOpnd::New(m_func->GetLocalClosureSym(), TyVar, m_func), dstOpnd, m_func),
            (uint32)-1);
    }

    if (dstSym->m_isSingleDef)
    {
        switch (newOpcode)
        {
        case Js::OpCode::NewScArray:
        case Js::OpCode::NewScArrayWithMissingValues:
            dstSym->m_isSafeThis = true;
            dstSym->m_isNotNumber = true;
            break;
        }
    }

    if (newOpcode == Js::OpCode::NewScArray || newOpcode == Js::OpCode::NewScArrayWithMissingValues)
    {
        // Undefined values in array literals ([0, undefined, 1]) are treated as missing values in some versions
        dstOpnd->SetValueType(
            ValueType::GetObject(ObjectType::Array)
                .SetHasNoMissingValues(newOpcode == Js::OpCode::NewScArray)
                .SetArrayTypeId(Js::TypeIds_Array));
        dstOpnd->SetValueTypeFixed();
    }
}